

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSplit.c
# Opt level: O3

void Spl_ManWinFindLeavesRoots(Spl_Man_t *p)

{
  uint *puVar1;
  int *piVar2;
  Gia_Man_t *pGVar3;
  int *piVar4;
  Gia_Obj_t *pGVar5;
  Vec_Wec_t *pVVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  int *piVar9;
  byte bVar10;
  Vec_Int_t *pVVar11;
  uint uVar12;
  Vec_Int_t *pVVar13;
  int iVar14;
  Vec_Bit_t *pVVar15;
  uint uVar16;
  undefined8 uVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  
  p->vLeaves->nSize = 0;
  pVVar11 = p->vAnds;
  if (0 < pVVar11->nSize) {
    lVar22 = 0;
    do {
      uVar20 = pVVar11->pArray[lVar22];
      if (((int)uVar20 < 0) || (pGVar3 = p->pGia, pGVar3->nObjs <= (int)uVar20)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pVVar15 = p->vMarksAnd;
      if (pVVar15->nSize <= (int)uVar20) {
LAB_007cb6d8:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                      ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
      }
      piVar4 = pVVar15->pArray;
      if (((uint)piVar4[uVar20 >> 5] >> (uVar20 & 0x1f) & 1) == 0) {
        __assert_fail("Vec_BitEntry(p->vMarksAnd, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                      ,0xd0,"void Spl_ManWinFindLeavesRoots(Spl_Man_t *)");
      }
      pGVar5 = pGVar3->pObjs;
      uVar17 = *(undefined8 *)(pGVar5 + uVar20);
      uVar12 = uVar20 - ((uint)uVar17 & 0x1fffffff);
      if (((int)uVar12 < 0) || ((uint)pVVar15->nSize <= uVar12)) goto LAB_007cb6d8;
      uVar16 = uVar12 >> 5;
      uVar18 = 1 << ((byte)uVar12 & 0x1f);
      if (((uint)piVar4[uVar16] >> (uVar12 & 0x1f) & 1) == 0) {
        if (pGVar3->vMapping2->nSize <= (int)uVar12) goto LAB_007cb6f7;
        if (pGVar3->vMapping2->pArray[uVar12].nSize == 0) {
          if (p->vMarksCIO->nSize <= (int)uVar12) goto LAB_007cb6d8;
          if ((p->vMarksCIO->pArray[uVar16] & uVar18) == 0) {
            __assert_fail("Gia_ObjIsLut2(p->pGia, iFan) || Vec_BitEntry(p->vMarksCIO, iFan)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                          ,0xd4,"void Spl_ManWinFindLeavesRoots(Spl_Man_t *)");
          }
        }
        piVar4[uVar16] = piVar4[uVar16] | uVar18;
        Vec_IntPush(p->vLeaves,uVar12);
        uVar17 = *(undefined8 *)(pGVar5 + uVar20);
        pVVar15 = p->vMarksAnd;
      }
      uVar20 = uVar20 - ((uint)((ulong)uVar17 >> 0x20) & 0x1fffffff);
      if (((int)uVar20 < 0) || (pVVar15->nSize <= (int)uVar20)) goto LAB_007cb6d8;
      uVar16 = uVar20 >> 5;
      uVar12 = pVVar15->pArray[uVar16];
      uVar18 = 1 << ((byte)uVar20 & 0x1f);
      if ((uVar12 >> (uVar20 & 0x1f) & 1) == 0) {
        pVVar6 = p->pGia->vMapping2;
        if (pVVar6->nSize <= (int)uVar20) goto LAB_007cb6f7;
        if (pVVar6->pArray[uVar20].nSize == 0) {
          if (p->vMarksCIO->nSize <= (int)uVar20) goto LAB_007cb6d8;
          if ((p->vMarksCIO->pArray[uVar16] & uVar18) == 0) {
            __assert_fail("Gia_ObjIsLut2(p->pGia, iFan) || Vec_BitEntry(p->vMarksCIO, iFan)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSplit.c"
                          ,0xdb,"void Spl_ManWinFindLeavesRoots(Spl_Man_t *)");
          }
        }
        pVVar15->pArray[uVar16] = uVar12 | uVar18;
        Vec_IntPush(p->vLeaves,uVar20);
      }
      lVar22 = lVar22 + 1;
      pVVar11 = p->vAnds;
    } while (lVar22 < pVVar11->nSize);
    pVVar13 = p->vLeaves;
    if (0 < pVVar13->nSize) {
      piVar4 = pVVar13->pArray;
      pVVar15 = p->vMarksAnd;
      lVar22 = 0;
      do {
        uVar20 = piVar4[lVar22];
        if (((int)uVar20 < 0) || (pVVar15->nSize <= (int)uVar20)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                        ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
        }
        bVar10 = (byte)uVar20 & 0x1f;
        puVar1 = (uint *)(pVVar15->pArray + (uVar20 >> 5));
        *puVar1 = *puVar1 & (-2 << bVar10 | 0xfffffffeU >> 0x20 - bVar10);
        lVar22 = lVar22 + 1;
      } while (lVar22 < pVVar13->nSize);
    }
  }
  p->vRoots->nSize = 0;
  pVVar13 = p->vNodes;
  iVar14 = pVVar13->nSize;
  if (0 < iVar14) {
    pGVar3 = p->pGia;
    pVVar6 = pGVar3->vMapping2;
    piVar4 = pVVar13->pArray;
    lVar22 = 0;
    do {
      lVar19 = (long)piVar4[lVar22];
      if ((lVar19 < 0) || (pVVar6->nSize <= piVar4[lVar22])) goto LAB_007cb6f7;
      pVVar7 = pVVar6->pArray;
      if (pVVar7 == (Vec_Int_t *)0x0) break;
      if (0 < pVVar7[lVar19].nSize) {
        piVar8 = pGVar3->pLutRefs;
        if (piVar8 == (int *)0x0) {
          __assert_fail("p->pLutRefs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x25c,"int Gia_ObjLutRefDecId(Gia_Man_t *, int)");
        }
        piVar9 = pVVar7[lVar19].pArray;
        lVar21 = 0;
        do {
          piVar2 = piVar8 + piVar9[lVar21];
          *piVar2 = *piVar2 + -1;
          lVar21 = lVar21 + 1;
        } while (lVar21 < pVVar7[lVar19].nSize);
        iVar14 = pVVar13->nSize;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < iVar14);
  }
  if (0 < pVVar11->nSize) {
    lVar22 = 0;
    do {
      piVar4 = p->pGia->pLutRefs;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pLutRefs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x25a,"int Gia_ObjLutRefNumId(Gia_Man_t *, int)");
      }
      if (piVar4[pVVar11->pArray[lVar22]] != 0) {
        Vec_IntPush(p->vRoots,pVVar11->pArray[lVar22]);
        pVVar11 = p->vAnds;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < pVVar11->nSize);
    pVVar13 = p->vNodes;
    iVar14 = pVVar13->nSize;
  }
  if (0 < iVar14) {
    pGVar3 = p->pGia;
    pVVar6 = pGVar3->vMapping2;
    piVar4 = pVVar13->pArray;
    lVar22 = 0;
    do {
      lVar19 = (long)piVar4[lVar22];
      if ((lVar19 < 0) || (pVVar6->nSize <= piVar4[lVar22])) {
LAB_007cb6f7:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar11 = pVVar6->pArray;
      if (pVVar11 == (Vec_Int_t *)0x0) {
        return;
      }
      if (0 < pVVar11[lVar19].nSize) {
        piVar8 = pGVar3->pLutRefs;
        if (piVar8 == (int *)0x0) {
          __assert_fail("p->pLutRefs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x25b,"int Gia_ObjLutRefIncId(Gia_Man_t *, int)");
        }
        piVar9 = pVVar11[lVar19].pArray;
        lVar21 = 0;
        do {
          piVar2 = piVar8 + piVar9[lVar21];
          *piVar2 = *piVar2 + 1;
          lVar21 = lVar21 + 1;
        } while (lVar21 < pVVar11[lVar19].nSize);
        iVar14 = pVVar13->nSize;
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < iVar14);
  }
  return;
}

Assistant:

void Spl_ManWinFindLeavesRoots( Spl_Man_t * p )
{
    Vec_Int_t * vVec;
    int iObj, iFan, i, k;
    // collect leaves
/*
    Vec_IntClear( p->vLeaves );
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
    {
        assert( Vec_BitEntry(p->vMarksNo, iObj) );
        Vec_IntForEachEntry( vVec, iFan, k )
            if ( !Vec_BitEntry(p->vMarksNo, iFan) )
            {
                Vec_BitWriteEntry(p->vMarksNo, iFan, 1);
                Vec_IntPush( p->vLeaves, iFan );
            }
    }
    Vec_IntForEachEntry( p->vLeaves, iFan, i )
        Vec_BitWriteEntry(p->vMarksNo, iFan, 0);
*/
    Vec_IntClear( p->vLeaves );
    Vec_IntForEachEntry( p->vAnds, iObj, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p->pGia, iObj );
        assert( Vec_BitEntry(p->vMarksAnd, iObj) );
        iFan = Gia_ObjFaninId0( pObj, iObj );
        if ( !Vec_BitEntry(p->vMarksAnd, iFan) )
        {
            assert( Gia_ObjIsLut2(p->pGia, iFan) || Vec_BitEntry(p->vMarksCIO, iFan) );
            Vec_BitWriteEntry(p->vMarksAnd, iFan, 1);
            Vec_IntPush( p->vLeaves, iFan );
        }
        iFan = Gia_ObjFaninId1( pObj, iObj );
        if ( !Vec_BitEntry(p->vMarksAnd, iFan) )
        {
            assert( Gia_ObjIsLut2(p->pGia, iFan) || Vec_BitEntry(p->vMarksCIO, iFan) );
            Vec_BitWriteEntry(p->vMarksAnd, iFan, 1);
            Vec_IntPush( p->vLeaves, iFan );
        }
    }
    Vec_IntForEachEntry( p->vLeaves, iFan, i )
        Vec_BitWriteEntry(p->vMarksAnd, iFan, 0);

    // collect roots
    Vec_IntClear( p->vRoots );
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            Gia_ObjLutRefDecId( p->pGia, iFan );
    Vec_IntForEachEntry( p->vAnds, iObj, i )
        if ( Gia_ObjLutRefNumId(p->pGia, iObj) )
            Vec_IntPush( p->vRoots, iObj );
    Gia_ManForEachLut2Vec( p->vNodes, p->pGia, vVec, iObj, i )
        Vec_IntForEachEntry( vVec, iFan, k )
            Gia_ObjLutRefIncId( p->pGia, iFan );
}